

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.c
# Opt level: O2

int uv__loop_configure(uv_loop_t *loop,uv_loop_option option,__va_list_tag *ap)

{
  uint uVar1;
  int *piVar2;
  
  if (option == UV_LOOP_BLOCK_SIGNAL) {
    uVar1 = ap->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      piVar2 = (int *)((ulong)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      piVar2 = (int *)ap->overflow_arg_area;
      ap->overflow_arg_area = piVar2 + 2;
    }
    if (*piVar2 != 0x1b) {
      return -0x16;
    }
    *(byte *)&loop->flags = (byte)loop->flags | 1;
  }
  else {
    if (option != UV_METRICS_IDLE_TIME) {
      return -0x26;
    }
    *(uint *)loop->internal_fields = *loop->internal_fields | 1;
  }
  return 0;
}

Assistant:

int uv__loop_configure(uv_loop_t* loop, uv_loop_option option, va_list ap) {
  uv__loop_internal_fields_t* lfields;

  lfields = uv__get_internal_fields(loop);
  if (option == UV_METRICS_IDLE_TIME) {
    lfields->flags |= UV_METRICS_IDLE_TIME;
    return 0;
  }

  if (option != UV_LOOP_BLOCK_SIGNAL)
    return UV_ENOSYS;

  if (va_arg(ap, int) != SIGPROF)
    return UV_EINVAL;

  loop->flags |= UV_LOOP_BLOCK_SIGPROF;
  return 0;
}